

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaDeriveFacetErr
               (xmlSchemaParserCtxtPtr pctxt,xmlSchemaFacetPtr facet1,xmlSchemaFacetPtr facet2,
               int lessGreater,int orEqual,int ofBase)

{
  xmlChar *pxVar1;
  xmlChar *pxVar2;
  char *pcVar3;
  
  pxVar1 = xmlStrdup("\'");
  pxVar2 = xmlSchemaFacetTypeToString(facet1->type);
  pxVar1 = xmlStrcat(pxVar1,pxVar2);
  pxVar1 = xmlStrcat(pxVar1,(xmlChar *)"\' has to be");
  if (lessGreater == 0) {
    pxVar1 = xmlStrcat(pxVar1," equal to");
  }
  pcVar3 = " less than";
  if (lessGreater == 1) {
    pcVar3 = " greater than";
  }
  pxVar1 = xmlStrcat(pxVar1,(xmlChar *)pcVar3);
  if (orEqual != 0) {
    pxVar1 = xmlStrcat(pxVar1,(xmlChar *)" or equal to");
  }
  pxVar1 = xmlStrcat(pxVar1," \'");
  pxVar2 = xmlSchemaFacetTypeToString(facet2->type);
  pxVar1 = xmlStrcat(pxVar1,pxVar2);
  pcVar3 = "\' of the base type";
  if (ofBase == 0) {
    pcVar3 = "\'";
  }
  pxVar1 = xmlStrcat(pxVar1,(xmlChar *)pcVar3);
  xmlSchemaPCustomErrExt
            (pctxt,XML_SCHEMAP_INVALID_FACET_VALUE,(xmlSchemaBasicItemPtr)facet1,(xmlNodePtr)0x0,
             (char *)pxVar1,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
  if (pxVar1 != (xmlChar *)0x0) {
    (*xmlFree)(pxVar1);
    return;
  }
  return;
}

Assistant:

static void
xmlSchemaDeriveFacetErr(xmlSchemaParserCtxtPtr pctxt,
			xmlSchemaFacetPtr facet1,
			xmlSchemaFacetPtr facet2,
			int lessGreater,
			int orEqual,
			int ofBase)
{
    xmlChar *msg = NULL;

    msg = xmlStrdup(BAD_CAST "'");
    msg = xmlStrcat(msg, xmlSchemaFacetTypeToString(facet1->type));
    msg = xmlStrcat(msg, BAD_CAST "' has to be");
    if (lessGreater == 0)
	msg = xmlStrcat(msg, BAD_CAST " equal to");
    if (lessGreater == 1)
	msg = xmlStrcat(msg, BAD_CAST " greater than");
    else
	msg = xmlStrcat(msg, BAD_CAST " less than");

    if (orEqual)
	msg = xmlStrcat(msg, BAD_CAST " or equal to");
    msg = xmlStrcat(msg, BAD_CAST " '");
    msg = xmlStrcat(msg, xmlSchemaFacetTypeToString(facet2->type));
    if (ofBase)
	msg = xmlStrcat(msg, BAD_CAST "' of the base type");
    else
	msg = xmlStrcat(msg, BAD_CAST "'");

    xmlSchemaPCustomErr(pctxt,
	XML_SCHEMAP_INVALID_FACET_VALUE,
	WXS_BASIC_CAST facet1, NULL,
	(const char *) msg, NULL);

    if (msg != NULL)
	xmlFree(msg);
}